

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CouchDBInterface.cc
# Opt level: O2

bool __thiscall CouchDBInterface::sendDocument(CouchDBInterface *this,JSONObject *object)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *__s;
  undefined8 uVar3;
  mapped_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  char *response;
  size_t response_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string url;
  string towritestring;
  
  JSON::JSONObject::toString_abi_cxx11_(&towritestring,object,0);
  response = (char *)0x0;
  response_size = 0;
  __stream = open_memstream(&response,&response_size);
  __s = (char *)operator_new__(0x100);
  curl_easy_setopt(this->handle,0x2f,1);
  std::operator+(&local_c8,"http://",&this->server);
  std::operator+(&local_a8,&local_c8,":");
  std::operator+(&local_88,&local_a8,&this->port);
  std::operator+(&local_e8,&local_88,"/");
  std::operator+(&local_118,&local_e8,&this->databasename);
  std::operator+(&url,&local_118,"/");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  curl_easy_setopt(this->handle,0x2712,url._M_dataplus._M_p);
  curl_easy_setopt(this->handle,0x271f,towritestring._M_dataplus._M_p);
  curl_easy_setopt(this->handle,0x2711,__stream);
  uVar3 = curl_slist_append(0,"Content-Type: application/json");
  curl_easy_setopt(this->handle,0x2727,uVar3);
  curl_easy_setopt(this->handle,0x271a,__s);
  iVar2 = curl_easy_perform(this->handle);
  fclose(__stream);
  curl_slist_free_all(uVar3);
  if (iVar2 == 0) {
    std::__cxx11::string::assign((char *)&this->last_curl_error);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,response,response + response_size);
    JSON::JSONObject::fromString(&this->last_couch_result,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"ok",(allocator<char> *)&local_e8);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
              ::operator[](&(this->last_couch_result).
                            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON::JSONValue>_>_>
                           ,&local_118);
    bVar1 = JSON::JSONValue::isBoolTrue(this_00);
    std::__cxx11::string::~string((string *)&local_118);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,__s,(allocator<char> *)&local_e8);
    std::__cxx11::string::operator=((string *)&this->last_curl_error,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    bVar1 = false;
  }
  operator_delete(__s,1);
  free(response);
  std::__cxx11::string::~string((string *)&url);
  std::__cxx11::string::~string((string *)&towritestring);
  return (bool)(iVar2 == 0 & bVar1);
}

Assistant:

bool CouchDBInterface::sendDocument(const JSONObject &object) {
	//here is what we want to send to couchdb
	string towritestring=object.toString();
	//here is space to store the response from the db
	char *response=NULL;
	size_t response_size=0;
    FILE *responseptr=open_memstream(&response,&response_size);
	//here is space to put curl error messages in
	char *errbuf=new char[CURL_ERROR_SIZE];
	//set up the curl options
	curl_easy_setopt(handle,CURLOPT_POST,1L);
	string url="http://"+server+":"+port+"/"+databasename+"/";
	curl_easy_setopt(handle,CURLOPT_URL,url.c_str());
	curl_easy_setopt(handle,CURLOPT_POSTFIELDS,towritestring.c_str());
	curl_easy_setopt(handle,CURLOPT_WRITEDATA,responseptr);
	struct curl_slist *slist=curl_slist_append(NULL, "Content-Type: application/json");
	curl_easy_setopt(handle,CURLOPT_HTTPHEADER,slist);
	curl_easy_setopt(handle,CURLOPT_ERRORBUFFER,errbuf);
	//perform the operation
	CURLcode result=curl_easy_perform(handle);
	//cleanup
    fclose(responseptr); //this has to be done to access the buffer
	curl_slist_free_all(slist);
	//check for curl error
	bool couchok=false;
	if(result!=CURLE_OK) {
		last_curl_error=string(errbuf);
	} else {
		last_curl_error="";
		last_couch_result.fromString(string(response,response_size));
		if(last_couch_result["ok"].isBoolTrue()) couchok=true; 
	}
	delete errbuf;
	//check for couchdb error
	free(response);
	return (result==0)&&couchok;
}